

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_transaction.cpp
# Opt level: O0

SetRawIssueAssetResponseStruct *
cfd::js::api::ElementsTransactionStructApi::SetRawIssueAsset
          (SetRawIssueAssetResponseStruct *__return_storage_ptr__,
          SetRawIssueAssetRequestStruct *request)

{
  SetRawIssueAssetRequestStruct *this;
  string *in_R8;
  allocator local_141;
  function<cfd::js::api::SetRawIssueAssetResponseStruct_(const_cfd::js::api::SetRawIssueAssetRequestStruct_&)>
  local_140;
  undefined1 local_120 [262];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  SetRawIssueAssetRequestStruct *pSStack_18;
  anon_class_1_0_00000001 call_func;
  SetRawIssueAssetRequestStruct *request_local;
  SetRawIssueAssetResponseStruct *result;
  
  local_1a = 0;
  pSStack_18 = request;
  SetRawIssueAssetResponseStruct::SetRawIssueAssetResponseStruct(__return_storage_ptr__);
  this = pSStack_18;
  std::
  function<cfd::js::api::SetRawIssueAssetResponseStruct(cfd::js::api::SetRawIssueAssetRequestStruct_const&)>
  ::
  function<cfd::js::api::ElementsTransactionStructApi::SetRawIssueAsset(cfd::js::api::SetRawIssueAssetRequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::SetRawIssueAssetResponseStruct(cfd::js::api::SetRawIssueAssetRequestStruct_const&)>
              *)local_120,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_140,"SetRawIssueAsset",&local_141);
  ExecuteStructApi<cfd::js::api::SetRawIssueAssetRequestStruct,cfd::js::api::SetRawIssueAssetResponseStruct>
            ((SetRawIssueAssetResponseStruct *)(local_120 + 0x20),(api *)this,
             (SetRawIssueAssetRequestStruct *)local_120,&local_140,in_R8);
  SetRawIssueAssetResponseStruct::operator=
            (__return_storage_ptr__,(SetRawIssueAssetResponseStruct *)(local_120 + 0x20));
  SetRawIssueAssetResponseStruct::~SetRawIssueAssetResponseStruct
            ((SetRawIssueAssetResponseStruct *)(local_120 + 0x20));
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::
  function<cfd::js::api::SetRawIssueAssetResponseStruct_(const_cfd::js::api::SetRawIssueAssetRequestStruct_&)>
  ::~function((function<cfd::js::api::SetRawIssueAssetResponseStruct_(const_cfd::js::api::SetRawIssueAssetRequestStruct_&)>
               *)local_120);
  return __return_storage_ptr__;
}

Assistant:

SetRawIssueAssetResponseStruct ElementsTransactionStructApi::SetRawIssueAsset(
    const SetRawIssueAssetRequestStruct& request) {
  auto call_func = [](const SetRawIssueAssetRequestStruct& request)
      -> SetRawIssueAssetResponseStruct {  // NOLINT
    SetRawIssueAssetResponseStruct response;

    ElementsAddressFactory address_factory;
    std::vector<TxInIssuanceParameters> issuance_param;
    std::vector<IssuanceOutput> issuance_output;

    for (auto& issuance : request.issuances) {
      ConfidentialTxOut asset_txout;
      ConfidentialTxOut token_txout;
      Amount asset_amount =
          Amount::CreateBySatoshiAmount(issuance.asset_amount);
      Amount token_amount =
          Amount::CreateBySatoshiAmount(issuance.token_amount);

      if (ElementsConfidentialAddress::IsConfidentialAddress(
              issuance.asset_address)) {
        ElementsConfidentialAddress confidential_addr(issuance.asset_address);
        if (issuance.is_remove_nonce) {
          asset_txout = ConfidentialTxOut(
              confidential_addr.GetUnblindedAddress(), ConfidentialAssetId(),
              asset_amount);
        } else {
          asset_txout = ConfidentialTxOut(
              confidential_addr, ConfidentialAssetId(), asset_amount);
        }
      } else {
        Address unblind_addr =
            address_factory.GetAddress(issuance.asset_address);
        asset_txout = ConfidentialTxOut(
            unblind_addr, ConfidentialAssetId(), asset_amount);
      }

      if (ElementsConfidentialAddress::IsConfidentialAddress(
              issuance.token_address)) {
        ElementsConfidentialAddress confidential_addr(issuance.token_address);
        if (issuance.is_remove_nonce) {
          token_txout = ConfidentialTxOut(
              confidential_addr.GetUnblindedAddress(), ConfidentialAssetId(),
              token_amount);
        } else {
          token_txout = ConfidentialTxOut(
              confidential_addr, ConfidentialAssetId(), token_amount);
        }
      } else {
        Address unblind_addr =
            address_factory.GetAddress(issuance.token_address);
        token_txout = ConfidentialTxOut(
            unblind_addr, ConfidentialAssetId(), token_amount);
      }

      TxInIssuanceParameters param;
      param.txid = Txid(issuance.txid);
      param.vout = issuance.vout;
      param.asset_amount = asset_amount;
      param.asset_txout = asset_txout;
      param.token_amount = token_amount;
      param.token_txout = token_txout;
      if (!issuance.contract_hash.empty()) {
        param.contract_hash = ByteData256(issuance.contract_hash);
      }
      param.is_blind = issuance.is_blind;
      issuance_param.push_back(param);
    }

    ElementsTransactionApi api;
    ConfidentialTransactionController ctxc =
        api.SetRawIssueAsset(request.tx, issuance_param, &issuance_output);

    for (const auto& output : issuance_output) {
      IssuanceDataResponseStruct res_issuance;
      res_issuance.txid = output.txid.GetHex();
      res_issuance.vout = output.vout;
      res_issuance.asset = output.output.asset.GetHex();
      res_issuance.entropy = output.output.entropy.GetHex();
      res_issuance.token = output.output.token.GetHex();

      response.issuances.push_back(res_issuance);
    }

    // すべて設定後にTxoutのRandomSort
    if (request.is_random_sort_tx_out) {
      ctxc.RandomSortTxOut();
    }
    response.hex = ctxc.GetHex();
    return response;
  };

  SetRawIssueAssetResponseStruct result;
  result = ExecuteStructApi<
      SetRawIssueAssetRequestStruct, SetRawIssueAssetResponseStruct>(
      request, call_func, std::string(__FUNCTION__));

  return result;
}